

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O0

Blend __thiscall
PartsBupOutputter::prepareImageInTmp
          (PartsBupOutputter *this,Image *img,Point pos,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask,Image *target)

{
  Color CVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  reference pMVar5;
  Color *pCVar6;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_RSI;
  Size in_RDI;
  __normal_iterator<Color_*,_std::vector<Color,_std::allocator<Color>_>_> __last;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_00000018;
  Image *in_stack_00000020;
  Image *in_stack_00000028;
  Point in_stack_00000030;
  Color px;
  int x;
  int y;
  MaskRect *section;
  const_iterator __end1;
  const_iterator __begin1;
  vector<MaskRect,_std::allocator<MaskRect>_> *__range1;
  bool hasFullyTransparent;
  bool hasPartiallyTransparent;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Blend BVar7;
  __normal_iterator<Color_*,_std::vector<Color,_std::allocator<Color>_>_> in_stack_ffffffffffffff40;
  uint8_t uStack_a1;
  uint local_a0;
  uint local_9c;
  __normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
  in_stack_ffffffffffffff78;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_ffffffffffffff80;
  
  Image::fastResize((Image *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),in_RDI);
  __last._M_current = (Color *)((long)in_RDI + 0x110);
  std::vector<Color,_std::allocator<Color>_>::begin
            ((vector<Color,_std::allocator<Color>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<Color,_std::allocator<Color>_>::end
            ((vector<Color,_std::allocator<Color>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::fill<__gnu_cxx::__normal_iterator<Color*,std::vector<Color,std::allocator<Color>>>,Color>
            (in_stack_ffffffffffffff40,__last,(Color *)in_RDI);
  bVar3 = 0;
  bVar2 = false;
  std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
            (in_stack_ffffffffffffff80,
             (vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_ffffffffffffff78._M_current);
  Image::drawOnto(in_stack_00000028,in_stack_00000020,in_stack_00000030,in_stack_00000018);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::~vector(in_RSI);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::begin
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<MaskRect,_std::allocator<MaskRect>_>::end
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)), bVar4
        ) {
    pMVar5 = __gnu_cxx::
             __normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
             ::operator*((__normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                          *)&stack0xffffffffffffff78);
    for (local_9c = (uint)pMVar5->y1; (int)local_9c < (int)(uint)pMVar5->y2; local_9c = local_9c + 1
        ) {
      for (local_a0 = (uint)pMVar5->x1; (int)local_a0 < (int)(uint)pMVar5->x2;
          local_a0 = local_a0 + 1) {
        pCVar6 = Image::pixel((Image *)in_RDI,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
        CVar1 = *pCVar6;
        pCVar6 = Image::pixel((Image *)in_RDI,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
        if (pCVar6->a != '\0') {
          uStack_a1 = CVar1.a;
          if (uStack_a1 == '\0') {
            bVar2 = true;
          }
          else if (uStack_a1 != 0xff) {
            bVar3 = 1;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>::
    operator++((__normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                *)&stack0xffffffffffffff78);
  }
  if (bVar2) {
    BVar7 = NotPossible;
  }
  else {
    BVar7 = (Blend)bVar3;
  }
  return BVar7;
}

Assistant:

Blend prepareImageInTmp(const Image& img, Point pos, const std::vector<MaskRect>& mask, const Image& target) {
		tmp.fastResize(img.size);
		std::fill(tmp.colorData.begin(), tmp.colorData.end(), Color());
		bool hasPartiallyTransparent = false;
		bool hasFullyTransparent = false;
		img.drawOnto(tmp, {0, 0}, mask);
		for (const auto& section : mask) {
			for (int y = section.y1; y < section.y2; y++) {
				for (int x = section.x1; x < section.x2; x++) {
					Color px = img.pixel(x, y);
					if (target.pixel(pos.x + x, pos.y + y).a == 0) {
						continue;
					}
					if (px.a == 0) {
						hasFullyTransparent = true;
					}
					else if (px.a < 255) {
						hasPartiallyTransparent = true;
					}
				}
			}
		}
		return hasFullyTransparent ? Blend::NotPossible
		     : hasPartiallyTransparent ? Blend::CustomBlend
		     : Blend::AlphaBlend;
	}